

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bossac.cpp
# Opt level: O0

void __thiscall BossaConfig::~BossaConfig(BossaConfig *this)

{
  BossaConfig *this_local;
  
  ~BossaConfig(this);
  operator_delete(this,0xa0);
  return;
}

Assistant:

virtual ~BossaConfig() {}